

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall
r_code::list<unsigned_short>::push_back_new_cell(list<unsigned_short> *this,unsigned_short *t)

{
  pointer *ppcVar1;
  iterator __position;
  cell c;
  cell local_28;
  
  local_28.data = *t;
  local_28.next = -1;
  local_28.prev = this->used_cells_tail;
  __position._M_current =
       (this->cells).
       super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->cells).
      super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<r_code::list<unsigned_short>::cell,std::allocator<r_code::list<unsigned_short>::cell>>::
    _M_realloc_insert<r_code::list<unsigned_short>::cell_const&>
              ((vector<r_code::list<unsigned_short>::cell,std::allocator<r_code::list<unsigned_short>::cell>>
                *)this,__position,&local_28);
  }
  else {
    *(ulong *)&(__position._M_current)->data = CONCAT62(local_28._18_6_,local_28.data);
    (__position._M_current)->next = -1;
    (__position._M_current)->prev = local_28.prev;
    ppcVar1 = &(this->cells).
               super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  this->used_cells_tail =
       ((long)(this->cells).
              super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->cells).
              super__Vector_base<r_code::list<unsigned_short>::cell,_std::allocator<r_code::list<unsigned_short>::cell>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + -1;
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }